

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O2

char * __thiscall
Memory::
PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
::TryAllocDecommittedPages<false>
          (PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
           *this,uint pageCount,
          PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> **pageSegment)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  code *pcVar4;
  uint uVar5;
  bool bVar6;
  int iVar7;
  undefined4 *puVar8;
  PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *this_00;
  char *pcVar9;
  DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *toList;
  ulong uVar10;
  undefined1 local_48 [8];
  EditingIterator i;
  
  i.super_Iterator.current._4_4_ = pageCount;
  iVar7 = (*this->_vptr_PageAllocatorBase[3])();
  if ((char)iVar7 == '\0') {
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x45c,"(!this->HasMultiThreadAccess())","!this->HasMultiThreadAccess()");
    if (!bVar6) {
LAB_0067a97c:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar8 = 0;
  }
  local_48 = (undefined1  [8])&this->decommitSegments;
  i.super_Iterator.list =
       (DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *)
       local_48;
  do {
    if (i.super_Iterator.list ==
        (DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *)0x0
       ) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar8 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                         ,0x66,"(current != nullptr)","current != nullptr");
      if (!bVar6) goto LAB_0067a97c;
      *puVar8 = 0;
    }
    i.super_Iterator.list =
         ((i.super_Iterator.list)->
         super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>).next
         .list;
    if ((undefined1  [8])i.super_Iterator.list == local_48) {
      return (char *)0x0;
    }
    this_00 = DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
              ::Iterator::Data((Iterator *)local_48);
    uVar1 = this_00->freePageCount;
    uVar2 = this_00->decommitPageCount;
    pcVar9 = PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::DoAllocDecommitPages<false>
                       (this_00,i.super_Iterator.current._4_4_);
    uVar5 = i.super_Iterator.current._4_4_;
    if (pcVar9 != (char *)0x0) {
      uVar3 = this_00->freePageCount;
      uVar10 = (this->freePageCount - (ulong)uVar1) + (ulong)uVar3;
      this->freePageCount = uVar10;
      this->decommitPageCount =
           (ulong)this_00->decommitPageCount + (this->decommitPageCount - (ulong)uVar2);
      if (uVar10 < this->debugMinFreePageCount) {
        this->debugMinFreePageCount = uVar10;
      }
      LogRecommitPages(this,(ulong)((i.super_Iterator.current._4_4_ - uVar1) + uVar3));
      LogAllocPages(this,(ulong)uVar5);
      if (this_00->decommitPageCount == 0) {
        toList = GetSegmentList(this,this_00);
        DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::
        EditingIterator::MoveCurrentTo((EditingIterator *)local_48,toList);
      }
      *pageSegment = this_00;
      return pcVar9;
    }
  } while( true );
}

Assistant:

char *
PageAllocatorBase<TVirtualAlloc, TSegment, TPageSegment>::TryAllocDecommittedPages(uint pageCount, TPageSegment ** pageSegment)
{
    Assert(!this->HasMultiThreadAccess());

    typename DListBase<TPageSegment>::EditingIterator i(&decommitSegments);

    while (i.Next())
    {
        TPageSegment * freeSegment = &i.Data();
        uint oldFreePageCount = freeSegment->GetFreePageCount();
        uint oldDecommitPageCount = freeSegment->GetDecommitPageCount();

        char * pages = freeSegment->template DoAllocDecommitPages<notPageAligned>(pageCount);
        if (pages != nullptr)
        {
            this->freePageCount = this->freePageCount - oldFreePageCount + freeSegment->GetFreePageCount();

#if DBG_DUMP
            this->decommitPageCount = this->decommitPageCount - oldDecommitPageCount + freeSegment->GetDecommitPageCount();
#endif
#if DBG
            UpdateMinimum(this->debugMinFreePageCount, this->freePageCount);
#endif
            uint recommitPageCount = pageCount - (oldFreePageCount - freeSegment->GetFreePageCount());
            LogRecommitPages(recommitPageCount);
            LogAllocPages(pageCount);

            if (freeSegment->GetDecommitPageCount() == 0)
            {
                auto toList = GetSegmentList(freeSegment);
                i.MoveCurrentTo(toList);
            }

            *pageSegment = freeSegment;
            return pages;
        }
    }
    return nullptr;
}